

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

void __thiscall indigox::Bond::Clear(Bond *this)

{
  value_type *__u;
  long in_RDI;
  __weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffd0;
  array<std::weak_ptr<indigox::Atom>,_2UL> *this_00;
  element_type *local_18;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffffd0);
  __u = (value_type *)(in_RDI + 0x18);
  local_18 = (element_type *)0x0;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (array<std::weak_ptr<indigox::Atom>,_2UL> *)&stack0xffffffffffffffe8;
  std::weak_ptr<indigox::Atom>::weak_ptr((weak_ptr<indigox::Atom> *)0x10e7d1);
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::fill(this_00,__u);
  std::weak_ptr<indigox::Atom>::~weak_ptr((weak_ptr<indigox::Atom> *)0x10e7ec);
  return;
}

Assistant:

void Bond::Clear() {
    mol_.reset();
    atoms_.fill(Atom_wp());
  }